

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O3

int simplify_conj(quest_t *conj,uint32 n_term,uint32 n_phone)

{
  uint32 *puVar1;
  int32 iVar2;
  uint32 uVar3;
  uint32 uVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  void *ptr;
  uint32 uVar8;
  ulong uVar9;
  ulong uVar10;
  quest_t *pqVar11;
  ulong n_elem;
  
  uVar8 = n_term;
  if (n_term != 1) {
    if (n_term == 0) {
      __assert_fail("n_term != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                    ,0x249,"int simplify_conj(quest_t *, uint32, uint32)");
    }
    n_elem = (ulong)n_term;
    ptr = __ckd_calloc__(n_elem,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                         ,0x24e);
    uVar10 = 0;
    do {
      uVar9 = 0;
      pqVar11 = conj;
      do {
        if ((uVar10 != uVar9) &&
           (((*(int *)((long)ptr + uVar10 * 4) == 0 || (*(int *)((long)ptr + uVar9 * 4) == 0)) &&
            (iVar6 = is_subset(conj + uVar10,pqVar11,n_phone), iVar6 != 0)))) {
          *(undefined4 *)((long)ptr + uVar9 * 4) = 1;
        }
        uVar9 = uVar9 + 1;
        pqVar11 = pqVar11 + 1;
      } while (n_elem != uVar9);
      uVar10 = uVar10 + 1;
    } while (uVar10 != n_elem);
    uVar7 = 0;
    uVar8 = 0;
    do {
      uVar10 = (ulong)uVar7;
      if (*(int *)((long)ptr + uVar10 * 4) != 0) {
        do {
          uVar10 = uVar10 + 1;
          uVar7 = uVar7 + 1;
          if (*(int *)((long)ptr + uVar10 * 4) == 0) break;
        } while (uVar10 < n_elem);
        if (n_term == uVar7) break;
      }
      if (uVar8 != uVar7) {
        pqVar11 = conj + uVar7;
        iVar2 = pqVar11->ctxt;
        uVar3 = pqVar11->neg;
        uVar4 = pqVar11->pset;
        uVar5 = *(undefined4 *)&pqVar11->field_0xc;
        puVar1 = (&conj[uVar7].member)[1];
        conj[uVar8].member = conj[uVar7].member;
        (&conj[uVar8].member)[1] = puVar1;
        pqVar11 = conj + uVar8;
        pqVar11->ctxt = iVar2;
        pqVar11->neg = uVar3;
        pqVar11->pset = uVar4;
        *(undefined4 *)&pqVar11->field_0xc = uVar5;
      }
      uVar8 = uVar8 + 1;
      uVar7 = uVar7 + 1;
    } while (uVar7 < n_term);
    ckd_free(ptr);
  }
  return uVar8;
}

Assistant:

int
simplify_conj(quest_t *conj,
	      uint32 n_term,
	      uint32 n_phone)
{
    uint32 i, j;
    int *del, exist_del = FALSE;

    assert(n_term != 0);

    if (n_term == 1)	/* Only one term; nothing to do */
	return 1;

    del = ckd_calloc(n_term, sizeof(int));

    /* Search for all pairs (i,j) where
     * term_i is a subset of term_j.  Mark
     * all such term_j's for deletion since
     * term_i && term_j == term_i */
    for (i = 0; i < n_term; i++) {
	for (j = 0; j < n_term; j++) {
	    if ((i != j) && (!del[i] || !del[j])) {
		if (is_subset(&conj[i], &conj[j], n_phone)) {
		    /* mark the superset for deletion */
		    del[j] = TRUE;
		    exist_del = TRUE;
		}
	    }
	}
    }

    /* compact the conjunction by removing
     * term_j's that are marked for deletion.
     */
    for (i = 0, j = 0; j < n_term; i++, j++) {
	if (del[j]) {
	    /* move j to the next
	     * non-deleted term (if any) */
	    for (j++; del[j] && (j < n_term); j++);
	    
	    if (j == n_term)
		break;
	}
	if (i != j) {
	    conj[i] = conj[j];
	}
    }

    ckd_free(del);

    return i;	/* return new n_term */
}